

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O0

void __thiscall wasm::DataFlow::Trace::findExternalUses(Trace *this)

{
  bool bVar1;
  int iVar2;
  reference __x;
  reference ppEVar3;
  size_type sVar4;
  ostream *poVar5;
  Expression *local_128;
  Expression *use;
  iterator __end4;
  iterator __begin4;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range4;
  size_type sStack_100;
  __node_base local_f8;
  size_type sStack_f0;
  _Prime_rehash_policy local_e8;
  __node_base_ptr local_d8;
  undefined1 local_d0 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> uses;
  Expression *origin_1;
  Node **node_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range2_1;
  Expression *local_70;
  Expression *origin;
  Node **node;
  iterator __end2;
  iterator __begin2;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range2;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  origins;
  Trace *this_local;
  
  origins._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  ::unordered_set((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                   *)&__range2);
  __end2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::begin
                     (&this->nodes);
  node = (Node **)std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::end
                            (&this->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                     *)&node), bVar1) {
    origin = (Expression *)
             __gnu_cxx::
             __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
             ::operator*(&__end2);
    local_70 = (*(Node **)origin)->origin;
    if (local_70 != (Expression *)0x0) {
      iVar2 = debug();
      if (1 < iVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"note origin ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_70);
        std::operator<<(poVar5,'\n');
      }
      std::
      unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
      ::insert((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                *)&__range2,&local_70);
    }
    __gnu_cxx::
    __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::begin
                       (&this->nodes);
  node_1 = (Node **)std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                    end(&this->nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                        *)&node_1);
    if (!bVar1) {
      std::
      unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
      ::~unordered_set((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                        *)&__range2);
      return;
    }
    __x = __gnu_cxx::
          __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
          ::operator*(&__end2_1);
    if ((*__x != this->toInfer) &&
       (uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(*__x)->origin,
       (Expression *)
       uses.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage != (Expression *)0x0)) {
      local_e8._M_max_load_factor = 0.0;
      local_e8._4_4_ = 0;
      local_e8._M_next_resize = 0;
      local_f8._M_nxt = (_Hash_node_base *)0x0;
      sStack_f0 = 0;
      __range4 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)0x0;
      sStack_100 = 0;
      local_d8 = (__node_base_ptr)0x0;
      UseFinder::UseFinder((UseFinder *)&__range4);
      UseFinder::getUses((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_d0
                         ,(UseFinder *)&__range4,
                         (Expression *)
                         uses.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this->graph,
                         this->localGraph);
      UseFinder::~UseFinder((UseFinder *)&__range4);
      __end4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin
                         ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          local_d0);
      use = (Expression *)
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_d0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                         *)&use), bVar1) {
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  ::operator*(&__end4);
        local_128 = *ppEVar3;
        if ((local_128 == (Expression *)0x0) ||
           (sVar4 = std::
                    unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                    ::count((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                             *)&__range2,&local_128), sVar4 == 0)) {
          iVar2 = debug();
          if (1 < iVar2) {
            std::operator<<((ostream *)&std::cout,"found external use for\n");
            DataFlow::dump(*__x,(ostream *)&std::cout,0);
            poVar5 = std::operator<<((ostream *)&std::cout,"  due to ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_128);
            std::operator<<(poVar5,'\n');
          }
          std::
          unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
          ::insert(&this->hasExternalUses,__x);
          break;
        }
        __gnu_cxx::
        __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
        ::operator++(&__end4);
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_d0);
    }
    __gnu_cxx::
    __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void findExternalUses() {
    // Find all the wasm code represented in this trace.
    std::unordered_set<Expression*> origins;
    for (auto& node : nodes) {
      if (auto* origin = node->origin) {
        if (debug() >= 2) {
          std::cout << "note origin " << origin << '\n';
        }
        origins.insert(origin);
      }
    }
    for (auto& node : nodes) {
      if (node == toInfer) {
        continue;
      }
      if (auto* origin = node->origin) {
        auto uses = UseFinder().getUses(origin, graph, localGraph);
        for (auto* use : uses) {
          // A non-set use (a drop or return etc.) is definitely external.
          // Otherwise, check if internal or external.
          if (use == nullptr || origins.count(use) == 0) {
            if (debug() >= 2) {
              std::cout << "found external use for\n";
              dump(node, std::cout);
              std::cout << "  due to " << use << '\n';
            }
            hasExternalUses.insert(node);
            break;
          }
        }
      }
    }
  }